

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req
          (raft_server *this,req_msg *req,req_ext_params *ext_params,uint64_t timestamp_us)

{
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_00;
  ulong *__mutex;
  code cVar1;
  _Manager_type p_Var2;
  _Manager_type p_Var3;
  pointer psVar4;
  long *plVar5;
  size_t us;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  ReturnCode RVar10;
  size_type sVar11;
  reference pvVar12;
  ulong uVar13;
  debugging_options *pdVar14;
  iterator iVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type __n;
  function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> *this_01;
  uint64_t in_R8;
  ptr<resp_msg> pVar16;
  ulong last_idx;
  ptr<resp_msg> resp;
  undefined1 local_148 [40];
  ptr<commit_ret_elem> elem;
  ulong cur_term;
  ptr<buffer> ret_value;
  ptr<buffer> buf;
  ptr<raft_params> params;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_98;
  raft_server *local_88;
  function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> local_80;
  function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> local_60;
  code *local_40;
  size_t local_38;
  
  resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  last_idx = 0;
  ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cur_term = (ulong)req[9].super_msg_base._vptr_msg_base[1];
  context::get_params((context *)&params);
  buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
  std::make_shared<nuraft::resp_msg,unsigned_long&,nuraft::msg_type,int&,std::atomic<int>&>
            ((unsigned_long *)local_148,(msg_type *)&cur_term,(int *)&buf,
             (atomic<int> *)&req->log_entries_);
  std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  if ((*(int *)&req[8].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) &&
     (((ulong)req[3].super_msg_base._vptr_msg_base & 1) == 0)) {
    if ((*(ulong *)(timestamp_us + 0x20) == 0) || (*(ulong *)(timestamp_us + 0x20) == cur_term)) {
      this_00 = (vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor._M_unused
                   + 8);
      p_Var2 = *(_Manager_type *)
                ((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8);
      p_Var3 = ext_params[1].after_precommit_.super__Function_base._M_manager;
      sVar11 = (long)p_Var3 - (long)p_Var2 >> 4;
      for (__n = 0; sVar11 != __n; __n = __n + 1) {
        pvVar12 = std::
                  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ::at(this_00,__n);
        ((pvVar12->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->term_
             = cur_term;
        pvVar12 = std::
                  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ::at(this_00,__n);
        ((pvVar12->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        timestamp_us_ = in_R8;
        pvVar12 = std::
                  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ::at(this_00,__n);
        uVar13 = store_log_entry((raft_server *)req,pvVar12,0);
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar9 = (*(code *)(psVar4->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (4 < iVar9) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_148,"append at log_idx %lu, timestamp %lu",uVar13,in_R8);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                       ,"handle_cli_req",0x7b,(string *)local_148);
            std::__cxx11::string::~string((string *)local_148);
          }
        }
        last_idx = uVar13;
        pvVar12 = std::
                  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ::at(this_00,__n);
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&buf,
                   &(((pvVar12->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)
        ;
        buffer::pos((buffer *)
                    CONCAT44(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._4_4_,
                             buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr._0_4_),0);
        elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)last_idx;
        elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&buf;
        (**(code **)(*(long *)req[9].last_log_term_ + 0x30))
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)local_148,
                   (long *)req[9].last_log_term_,&elem);
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)local_148);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
        if (*(long *)(timestamp_us + 0x10) != 0) {
          local_148._0_8_ = last_idx;
          local_148._8_8_ = cur_term;
          local_148._16_8_ = *(size_type *)(timestamp_us + 0x28);
          std::function<void_(const_nuraft::raft_server::req_ext_cb_params_&)>::operator()
                    ((function<void_(const_nuraft::raft_server::req_ext_cb_params_&)> *)timestamp_us
                     ,(req_ext_cb_params *)local_148);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      if (p_Var3 != p_Var2) {
        plVar5 = *(long **)&req[9].super_msg_base.type_;
        (**(code **)(*plVar5 + 0x38))(plVar5,last_idx - sVar11);
      }
      try_update_precommit_index((raft_server *)req,last_idx,10);
      uVar13 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           *(undefined4 *)
            &(req->log_entries_).
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           *(undefined4 *)((long)&req->commit_idx_ + 4);
      buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           0xffffffff;
      RVar10 = cb_func::call((cb_func *)(*(long *)&req[4].super_msg_base.dst_ + 0x70),AppendLogs,
                             (Param *)&buf);
      if (RVar10 == ReturnNull) {
        this->_vptr_raft_server = (_func_int **)0x0;
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        goto LAB_0012ef7d;
      }
      pdVar14 = debugging_options::get_instance();
      us = (pdVar14->handle_cli_req_sleep_us_).super___atomic_base<unsigned_long>._M_i;
      if (us != 0) {
        timer_helper::sleep_us(us);
      }
      get_config((raft_server *)local_148);
      cVar1 = *(code *)(local_148._0_8_ + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
      if (cVar1 == (code)0x0) {
        std::make_shared<nuraft::raft_server::commit_ret_elem>();
        (elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->idx_ = last_idx;
        (elem.super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->result_code_ = TIMEOUT;
        __mutex = &req[0x10].super_msg_base.term_;
        std::mutex::lock((mutex *)__mutex);
        iVar15 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                 ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                         *)&req[0xf].last_log_idx_,&last_idx);
        if (iVar15._M_node == (_Base_ptr)&req[0xf].commit_idx_) {
          local_148._0_8_ = last_idx;
          std::__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr((__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                        *)(local_148 + 8),
                       &elem.
                        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      );
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                      *)&req[0xf].last_log_idx_,
                     (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                     local_148);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10));
        }
        else {
          std::__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>::
          operator=(&elem.
                     super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&iVar15._M_node[1]._M_parent);
          psVar4 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (psVar4 != (pointer)0x0) {
            iVar9 = (*(code *)(psVar4->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ();
            if (5 < iVar9) {
              psVar4 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              msg_if_given_abi_cxx11_
                        ((string *)local_148,"commit thread was faster than this thread: %p",
                         elem.
                         super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)(psVar4,6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                               ,"handle_cli_req",0xaa,local_148);
              std::__cxx11::string::~string((string *)local_148);
            }
          }
        }
        context::get_params((context *)local_148);
        iVar9 = *(int *)&(((resp_cb *)(local_148._0_8_ + 0x58))->super__Function_base)._M_functor;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
        peVar7 = resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (iVar9 == 1) {
          if (((elem.
                super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->async_result_).
              super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0) {
            std::
            make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                      ();
            std::
            __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ::operator=(&((elem.
                           super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->async_result_).
                         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                        ,(__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)local_148);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
          }
          peVar7 = resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_40 = handle_cli_req_callback_async;
          local_38 = 0;
          local_88 = (raft_server *)req;
          std::
          _Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>)>
          ::
          _Bind<nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&>
                    ((_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>)>
                      *)local_148,(offset_in_raft_server_to_subr *)&local_40,&local_88,
                     &(elem.
                       super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->async_result_);
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>()>
          ::
          function<std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>)>,void>
                    ((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>()>
                      *)&local_80,
                     (_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>
                      *)local_148);
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
          ::operator=(&peVar7->async_cb_func_,
                      (function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                       *)&local_80);
          this_01 = &local_80;
        }
        else {
          local_148._0_8_ = handle_cli_req_callback;
          local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr((__shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                        *)(local_148 + 0x10),
                       &elem.
                        super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      );
          local_148._32_8_ = req;
          std::function<std::shared_ptr<nuraft::resp_msg>(std::shared_ptr<nuraft::resp_msg>)>::
          function<std::_Bind<std::shared_ptr<nuraft::resp_msg>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::shared_ptr<nuraft::resp_msg>)>,void>
                    ((function<std::shared_ptr<nuraft::resp_msg>(std::shared_ptr<nuraft::resp_msg>)>
                      *)&local_60,
                     (_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>
                      *)local_148);
          std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::
          operator=(&peVar7->cb_func_,&local_60);
          this_01 = &local_60;
        }
        std::_Function_base::~_Function_base(&this_01->super__Function_base);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x18));
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        p_Var6 = (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &elem.
                  super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
        ;
      }
      else {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar9 = (*(code *)(psVar4->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (4 < iVar9) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_148,"asynchronously replicated %lu, return value %p",last_idx
                       ,ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                       ,"handle_cli_req",0xca,local_148);
            std::__cxx11::string::~string((string *)local_148);
          }
        }
        peVar7 = resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_98,
                   &ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(peVar7->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                   &local_98);
        p_Var6 = &local_98;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var6->_M_refcount);
      (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_idx_ =
           uVar13;
      (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->accepted_ =
           true;
    }
    else {
      (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->result_code_ =
           TERM_MISMATCH;
    }
  }
  else {
    (resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->result_code_ =
         NOT_LEADER;
  }
  _Var8._M_pi = resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  this->_vptr_raft_server =
       (_func_int **)resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var8._M_pi;
  resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
LAB_0012ef7d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret_value.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req,
                                          const req_ext_params& ext_params,
                                          uint64_t timestamp_us)
{
    ptr<resp_msg> resp = nullptr;
    ulong last_idx = 0;
    ptr<buffer> ret_value = nullptr;
    ulong resp_idx = 1;
    ulong cur_term = state_->get_term();
    ptr<raft_params> params = ctx_->get_params();

    resp = cs_new<resp_msg>( cur_term,
                             msg_type::append_entries_response,
                             id_,
                             leader_ );
    if (role_ != srv_role::leader || write_paused_) {
        resp->set_result_code( cmd_result_code::NOT_LEADER );
        return resp;
    }

    if (ext_params.expected_term_) {
        // If expected term is given, check the current term.
        if (ext_params.expected_term_ != cur_term) {
            resp->set_result_code( cmd_result_code::TERM_MISMATCH );
            return resp;
        }
    }

    std::vector< ptr<log_entry> >& entries = req.log_entries();
    size_t num_entries = entries.size();

    for (size_t i = 0; i < num_entries; ++i) {
        // force the log's term to current term
        entries.at(i)->set_term(cur_term);
        entries.at(i)->set_timestamp(timestamp_us);

        ulong next_slot = store_log_entry(entries.at(i));
        p_db("append at log_idx %" PRIu64 ", timestamp %" PRIu64,
             next_slot, timestamp_us);
        last_idx = next_slot;

        ptr<buffer> buf = entries.at(i)->get_buf_ptr();
        buf->pos(0);
        ret_value = state_machine_->pre_commit_ext
                    ( state_machine::ext_op_params( last_idx, buf ) );

        if (ext_params.after_precommit_) {
            req_ext_cb_params cb_params;
            cb_params.log_idx = last_idx;
            cb_params.log_term = cur_term;
            cb_params.context = ext_params.context_;
            ext_params.after_precommit_(cb_params);
        }
    }
    if (num_entries) {
        log_store_->end_of_append_batch(last_idx - num_entries, num_entries);
    }
    try_update_precommit_index(last_idx);
    resp_idx = log_store_->next_slot();

    // Finished appending logs and pre_commit of itself.
    cb_func::Param param(id_, leader_);
    param.ctx = &last_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::AppendLogs, &param);
    if (rc == CbReturnCode::ReturnNull) return nullptr;

    size_t sleep_us = debugging_options::get_instance()
                      .handle_cli_req_sleep_us_.load(std::memory_order_relaxed);
    if (sleep_us) {
        // Sleep if the debugging option is given.
        timer_helper::sleep_us(sleep_us);
    }

    if (!get_config()->is_async_replication()) {
        // Sync replication:
        //   Set callback function for `last_idx`.
        ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
        elem->idx_ = last_idx;
        elem->result_code_ = cmd_result_code::TIMEOUT;

        {   auto_lock(commit_ret_elems_lock_);
            auto entry = commit_ret_elems_.find(last_idx);
            if (entry != commit_ret_elems_.end()) {
                // Commit thread was faster than this.
                elem = entry->second;
                p_tr("commit thread was faster than this thread: %p", elem.get());
            } else {
                commit_ret_elems_.insert( std::make_pair(last_idx, elem) );
            }

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                // Blocking call: set callback function waiting for the result.
                resp->set_cb( std::bind( &raft_server::handle_cli_req_callback,
                                         this,
                                         elem,
                                         std::placeholders::_1 ) );
                break;

            case raft_params::async_handler:
                // Async handler: create & set async result object.
                if (!elem->async_result_) {
                    elem->async_result_ = cs_new< cmd_result< ptr<buffer> > >();
                }
                resp->set_async_cb
                      ( std::bind( &raft_server::handle_cli_req_callback_async,
                                   this,
                                   elem->async_result_ ) );
                break;
            }
        }

    } else {
        // Async replication:
        //   Immediately return with the result of pre-commit.
        p_dv( "asynchronously replicated %" PRIu64 ", return value %p",
              last_idx, ret_value.get() );
        resp->set_ctx(ret_value);
    }

    resp->accept(resp_idx);
    return resp;
}